

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::_q_contentsChanged
          (QWidgetTextControlPrivate *this,int from,int charsRemoved,int charsAdded)

{
  bool bVar1;
  QAccessibleTextUpdateEvent *this_00;
  ulong uVar2;
  QObject *pQVar3;
  MoveMode *pMVar4;
  QObject *obj;
  int in_ECX;
  int in_EDX;
  MoveMode in_ESI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QAccessibleEvent *ev;
  QWidgetTextControl *q;
  QString oldText;
  QString newText;
  QTextCursor tmp;
  QString *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff68;
  QAccessibleTextRemoveEvent *in_stack_ffffffffffffff70;
  int iVar5;
  QObject *obj_00;
  QChar local_4a;
  QString local_48;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int local_18;
  int local_14;
  undefined1 *local_10;
  long local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAccessibleTextUpdateEvent *)q_func(in_RDI);
  uVar2 = QAccessible::isActive();
  if (((uVar2 & 1) != 0) &&
     (pQVar3 = QObject::parent((QObject *)0x7115b9), pQVar3 != (QObject *)0x0)) {
    QObject::parent((QObject *)0x7115cd);
    bVar1 = QObject::isWidgetType((QObject *)0x7115d5);
    if (bVar1) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_10,in_RDI->doc);
      QTextCursor::setPosition((int)&local_10,in_ESI);
      local_14 = QTextDocument::characterCount();
      local_14 = local_14 + -1;
      local_18 = in_ESI + in_ECX;
      pMVar4 = (MoveMode *)qMin<int>(&local_14,&local_18);
      QTextCursor::setPosition((int)&local_10,*pMVar4);
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::selectedText();
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (QObject *)(long)in_EDX;
      QChar::QChar<char16_t,_true>(&local_4a,L' ');
      QString::QString(&local_48,(longlong)pQVar3,(QChar *)(ulong)(ushort)local_4a.ucs);
      obj_00 = (QObject *)0x0;
      if (in_EDX == 0) {
        obj = (QObject *)operator_new(0x40);
        QObject::parent((QObject *)0x71171c);
        QAccessibleTextInsertEvent::QAccessibleTextInsertEvent
                  ((QAccessibleTextInsertEvent *)in_RDI,pQVar3,(int)((ulong)obj >> 0x20),
                   in_stack_ffffffffffffff68);
      }
      else if (in_ECX == 0) {
        obj = (QObject *)operator_new(0x40);
        QObject::parent((QObject *)0x711761);
        QAccessibleTextRemoveEvent::QAccessibleTextRemoveEvent
                  (in_stack_ffffffffffffff70,obj,iVar5,in_stack_ffffffffffffff58);
      }
      else {
        obj = (QObject *)operator_new(0x58);
        iVar5 = (int)((ulong)in_RDI >> 0x20);
        QObject::parent((QObject *)0x71179c);
        QAccessibleTextUpdateEvent::QAccessibleTextUpdateEvent
                  (this_00,obj_00,iVar5,(QString *)pQVar3,(QString *)in_stack_ffffffffffffff70);
      }
      QAccessible::updateAccessibility((QAccessibleEvent *)obj);
      if (obj != (QObject *)0x0) {
        (**(code **)(*(long *)obj + 8))();
      }
      QString::~QString((QString *)0x7117f0);
      QString::~QString((QString *)0x7117fa);
      QTextCursor::~QTextCursor((QTextCursor *)&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::_q_contentsChanged(int from, int charsRemoved, int charsAdded)
{
#if QT_CONFIG(accessibility)
    Q_Q(QWidgetTextControl);

    if (QAccessible::isActive() && q->parent() && q->parent()->isWidgetType()) {
        QTextCursor tmp(doc);
        tmp.setPosition(from);
        // when setting a new text document the length is off
        // QTBUG-32583 - characterCount is off by 1 requires the -1
        tmp.setPosition(qMin(doc->characterCount() - 1, from + charsAdded), QTextCursor::KeepAnchor);
        QString newText = tmp.selectedText();

        // always report the right number of removed chars, but in lack of the real string use spaces
        QString oldText = QString(charsRemoved, u' ');

        QAccessibleEvent *ev = nullptr;
        if (charsRemoved == 0) {
            ev = new QAccessibleTextInsertEvent(q->parent(), from, newText);
        } else if (charsAdded == 0) {
            ev = new QAccessibleTextRemoveEvent(q->parent(), from, oldText);
        } else {
            ev = new QAccessibleTextUpdateEvent(q->parent(), from, oldText, newText);
        }
        QAccessible::updateAccessibility(ev);
        delete ev;
    }
#else
    Q_UNUSED(from);
    Q_UNUSED(charsRemoved);
    Q_UNUSED(charsAdded);
#endif
}